

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblySource.cpp
# Opt level: O3

void __thiscall
Js::WebAssemblySource::ReadBufferSource
          (WebAssemblySource *this,Var val,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  BOOL BVar5;
  TypedArrayBase *pTVar6;
  ArrayBuffer *pAVar7;
  undefined4 extraout_var;
  undefined4 *puVar8;
  Recycler *this_00;
  BYTE *dst;
  undefined1 local_58 [8];
  TrackAllocData data;
  Type src;
  
  bVar2 = VarIs<Js::TypedArrayBase>(val);
  if (bVar2) {
    pTVar6 = VarTo<Js::TypedArrayBase>(val);
    src = pTVar6->buffer;
    uVar3 = pTVar6->BYTES_PER_ELEMENT * (pTVar6->super_ArrayBufferParent).super_ArrayObject.length;
  }
  else {
    bVar2 = VarIs<Js::ArrayBuffer>(val);
    if (!bVar2) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e4a6,(PCWSTR)0x0);
    }
    pAVar7 = VarTo<Js::ArrayBuffer>(val);
    iVar4 = (*(pAVar7->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(pAVar7);
    src = (Type)CONCAT44(extraout_var,iVar4);
    uVar3 = (*(pAVar7->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x71])(pAVar7);
  }
  this->bufferLength = uVar3;
  if ((src == (Type)0x0) && (uVar3 != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/WebAssemblySource.cpp"
                                ,0x2f,"(srcBuffer || bufferLength == 0)",
                                "srcBuffer || bufferLength == 0");
    if (!bVar2) goto LAB_00959f56;
    *puVar8 = 0;
    uVar3 = this->bufferLength;
  }
  if (uVar3 != 0) {
    data.plusSize = (size_t)uVar3;
    local_58 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_483503d;
    data.filename._0_4_ = 0x33;
    this_00 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
    uVar3 = this->bufferLength;
    if ((ulong)uVar3 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      dst = &DAT_00000008;
    }
    else {
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00959f56;
        *puVar8 = 0;
      }
      dst = (BYTE *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                              (this_00,(ulong)uVar3);
      if (dst == (BYTE *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) {
LAB_00959f56:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar8 = 0;
        dst = (BYTE *)0x0;
      }
    }
    this->buffer = dst;
    js_memcpy_s(dst,(ulong)this->bufferLength,src,(ulong)this->bufferLength);
  }
  return;
}

Assistant:

void WebAssemblySource::ReadBufferSource(Var val, ScriptContext * scriptContext)
{
    BYTE* srcBuffer;
    if (Js::VarIs<Js::TypedArrayBase>(val))
    {
        Js::TypedArrayBase* array = Js::VarTo<Js::TypedArrayBase>(val);
        srcBuffer = array->GetByteBuffer();
        bufferLength = array->GetByteLength();
    }
    else if (Js::VarIs<Js::ArrayBuffer>(val))
    {
        Js::ArrayBuffer* arrayBuffer = Js::VarTo<Js::ArrayBuffer>(val);
        srcBuffer = arrayBuffer->GetBuffer();
        bufferLength = arrayBuffer->GetByteLength();
    }
    else
    {
        // The buffer was not a TypedArray nor an ArrayBuffer
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedBufferSource);
    }
    Assert(srcBuffer || bufferLength == 0);
    if (bufferLength > 0)
    {
        // copy buffer so external changes to it don't cause issues when defer parsing
        buffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), byte, bufferLength);
        js_memcpy_s(buffer, bufferLength, srcBuffer, bufferLength);
    }
}